

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmGraph.cpp
# Opt level: O0

void PrintName(InstructionVMGraphContext *ctx,VmValue *value,bool fullName,bool noExtraInfo)

{
  FunctionData *pFVar1;
  bool bVar2;
  uint uVar3;
  VmConstant *constant_00;
  VmInstruction *pVVar4;
  char *format;
  byte *pbVar5;
  VmBlock *pVVar6;
  VmFunction *pVVar7;
  FunctionData *fData;
  VmFunction *function_1;
  VmBlock *block_1;
  uint i;
  VmFunction *function;
  VmBlock *block;
  VmInstruction *inst;
  VmConstant *constant;
  bool noExtraInfo_local;
  bool fullName_local;
  VmValue *value_local;
  InstructionVMGraphContext *ctx_local;
  
  constant_00 = getType<VmConstant>(value);
  constant._6_1_ = noExtraInfo;
  if (constant_00 == (VmConstant *)0x0) {
    pVVar4 = getType<VmInstruction>(value);
    if (pVVar4 == (VmInstruction *)0x0) {
      pVVar6 = getType<VmBlock>(value);
      if (pVVar6 == (VmBlock *)0x0) {
        pVVar7 = getType<VmFunction>(value);
        if (pVVar7 == (VmFunction *)0x0) {
          if (value != (VmValue *)0x0) {
            __assert_fail("!\"unknown type\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmGraph.cpp"
                          ,0x8e,"void PrintName(InstructionVMGraphContext &, VmValue *, bool, bool)"
                         );
          }
          Print(ctx,"%%null%%");
          constant._6_1_ = 1;
        }
        else {
          pFVar1 = pVVar7->function;
          if (pFVar1 == (FunctionData *)0x0) {
            Print(ctx,"global");
          }
          else {
            Print(ctx,"%.*s.f%04x",
                  (ulong)(uint)((int)(pFVar1->name->name).end - (int)(pFVar1->name->name).begin),
                  (pFVar1->name->name).begin,(ulong)pFVar1->uniqueId);
          }
        }
      }
      else {
        Print(ctx,"%.*s.b%d",(ulong)(uint)((int)(pVVar6->name).end - (int)(pVVar6->name).begin),
              (pVVar6->name).begin,(ulong)pVVar6->uniqueId);
      }
    }
    else {
      if ((fullName) && (pVVar6 = pVVar4->parent, pVVar6 != (VmBlock *)0x0)) {
        if (pVVar6->parent != (VmFunction *)0x0) {
          PrintName(ctx,&pVVar6->parent->super_VmValue,true,true);
          Print(ctx,".");
        }
        PrintName(ctx,&pVVar6->super_VmValue,true,true);
        Print(ctx,".");
      }
      Print(ctx,"%%%d",(ulong)pVVar4->uniqueId);
      if (pVVar4->color != 0) {
        Print(ctx,".c%d",(ulong)pVVar4->color);
      }
      bVar2 = SmallArray<unsigned_char,_8U>::empty(&pVVar4->regVmRegisters);
      if (!bVar2) {
        Print(ctx,".r");
        for (block_1._4_4_ = 0; uVar3 = SmallArray<unsigned_char,_8U>::size(&pVVar4->regVmRegisters)
            , block_1._4_4_ < uVar3; block_1._4_4_ = block_1._4_4_ + 1) {
          format = "|%d";
          if (block_1._4_4_ == 0) {
            format = "%d";
          }
          pbVar5 = SmallArray<unsigned_char,_8U>::operator[](&pVVar4->regVmRegisters,block_1._4_4_);
          Print(ctx,format,(ulong)*pbVar5);
        }
      }
    }
  }
  else {
    PrintConstant(ctx,constant_00);
  }
  if ((constant._6_1_ & 1) == 0) {
    if ((ctx->showFullTypes & 1U) != 0) {
      if ((value->type).structType == (TypeBase *)0x0) {
        Print(ctx," <");
        PrintType(ctx,value->type);
        Print(ctx,">");
      }
      else {
        Print(ctx," <%.*s>",
              (ulong)(uint)((int)(((value->type).structType)->name).end -
                           (int)(((value->type).structType)->name).begin),
              (((value->type).structType)->name).begin);
      }
    }
    if (((ctx->showComments & 1U) != 0) && (bVar2 = InplaceStr::empty(&value->comment), !bVar2)) {
      Print(ctx," (%.*s)",(ulong)(uint)((int)(value->comment).end - (int)(value->comment).begin),
            (value->comment).begin);
    }
  }
  return;
}

Assistant:

void PrintName(InstructionVMGraphContext &ctx, VmValue *value, bool fullName, bool noExtraInfo)
{
	if(VmConstant *constant = getType<VmConstant>(value))
	{
		PrintConstant(ctx, constant);
	}
	else if(VmInstruction *inst = getType<VmInstruction>(value))
	{
		if(fullName)
		{
			if(VmBlock *block = inst->parent)
			{
				if(VmFunction *function = block->parent)
				{
					PrintName(ctx, function, true, true);
					Print(ctx, ".");
				}

				PrintName(ctx, block, true, true);
				Print(ctx, ".");
			}
		}

		Print(ctx, "%%%d", inst->uniqueId);

		if(inst->color)
			Print(ctx, ".c%d", inst->color);

		if(!inst->regVmRegisters.empty())
		{
			Print(ctx, ".r");

			for(unsigned i = 0; i < inst->regVmRegisters.size(); i++)
				Print(ctx, i == 0 ? "%d" : "|%d", inst->regVmRegisters[i]);
		}
	}
	else if(VmBlock *block = getType<VmBlock>(value))
	{
		Print(ctx, "%.*s.b%d", FMT_ISTR(block->name), block->uniqueId);
	}
	else if(VmFunction *function = getType<VmFunction>(value))
	{
		if(FunctionData *fData = function->function)
			Print(ctx, "%.*s.f%04x", FMT_ISTR(fData->name->name), fData->uniqueId);
		else
			Print(ctx, "global");
	}
	else if(!value)
	{
		Print(ctx, "%%null%%");

		noExtraInfo = true;
	}
	else
	{
		assert(!"unknown type");
	}

	if(noExtraInfo)
		return;

	if(ctx.showFullTypes)
	{
		if(value->type.structType)
		{
			Print(ctx, " <%.*s>", FMT_ISTR(value->type.structType->name));
		}
		else
		{
			Print(ctx, " <");
			PrintType(ctx, value->type);
			Print(ctx, ">");
		}
	}

	if(ctx.showComments && !value->comment.empty())
		Print(ctx, " (%.*s)", FMT_ISTR(value->comment));
}